

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_variantSetSpecStmt
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                   *vslist,uint32_t indent)

{
  _Base_ptr p_Var1;
  long lVar2;
  string *psVar3;
  uint indent_00;
  ostream *poVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  iterator iVar7;
  uint32_t uVar8;
  size_type *psVar9;
  _Base_ptr p_Var10;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar11;
  long lVar12;
  long extraout_RDX_04;
  long extraout_RDX_05;
  _Rb_tree_node_base *p_Var13;
  const_iterator __begin4;
  _Base_ptr this;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  primNameTable;
  token nameTok;
  stringstream ss;
  undefined1 local_278 [12];
  undefined4 uStack_26c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 *local_258;
  undefined8 local_250;
  uint local_244;
  string local_240;
  string local_220;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string *local_1e0;
  ulong local_1d8;
  _Rb_tree_header *local_1d0;
  _Rb_tree_node_base *local_1c8;
  _Base_ptr *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar14 = (ulong)indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  p_Var10 = (vslist->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  auVar17._8_8_ = extraout_RDX;
  auVar17._0_8_ = p_Var10;
  local_1d0 = &(vslist->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != local_1d0) {
    local_244 = indent + 1;
    indent_00 = indent + 2;
    local_1d8 = uVar14;
    do {
      p_Var13 = auVar17._0_8_;
      if (p_Var13[4]._M_parent != (_Base_ptr)0x0) {
        pprint::Indent_abi_cxx11_(&local_220,(pprint *)(uVar14 & 0xffffffff),auVar17._8_4_);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"variantSet ",0xb);
        local_200 = local_1f0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
        local_278._0_8_ = &local_268;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,local_200,local_1f8 + (long)local_200);
        ::std::__cxx11::string::_M_append((char *)local_278,*(ulong *)(p_Var13 + 1));
        plVar5 = (long *)::std::__cxx11::string::_M_append((char *)local_278,(ulong)local_200);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_240.field_2._M_allocated_capacity = *psVar9;
          local_240.field_2._8_8_ = plVar5[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar9;
          local_240._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_240._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ != &local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
        }
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," = {\n",5);
        uVar11 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          uVar11 = extraout_RDX_01;
        }
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
          uVar11 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          uVar11 = extraout_RDX_03;
        }
        auVar16._8_8_ = uVar11;
        auVar16._0_8_ = p_Var13[3]._M_right;
        local_1c0 = &p_Var13[3]._M_parent;
        bVar15 = p_Var13[3]._M_right == (_Base_ptr)local_1c0;
        local_1c8 = p_Var13;
        while( true ) {
          uVar14 = local_1d8;
          p_Var13 = auVar16._0_8_;
          if (bVar15) break;
          pprint::Indent_abi_cxx11_(&local_220,(pprint *)(ulong)local_244,auVar16._8_4_);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
          local_200 = local_1f0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
          local_278._0_8_ = &local_268;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_278,local_200,local_1f8 + (long)local_200);
          ::std::__cxx11::string::_M_append((char *)local_278,*(ulong *)(p_Var13 + 1));
          plVar5 = (long *)::std::__cxx11::string::_M_append((char *)local_278,(ulong)local_200);
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_240.field_2._M_allocated_capacity = *psVar9;
            local_240.field_2._8_8_ = plVar5[3];
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          }
          else {
            local_240.field_2._M_allocated_capacity = *psVar9;
            local_240._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_240._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ != &local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
          }
          uVar8 = (uint32_t)psVar9;
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if (local_200 != local_1f0) {
            operator_delete(local_200,local_1f0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          bVar15 = PrimMetas::authored((PrimMetas *)&p_Var13[0xb]._M_right);
          if (bVar15) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
            print_prim_metas_abi_cxx11_
                      ((string *)local_278,(tinyusdz *)&p_Var13[0xb]._M_right,
                       (PrimMeta *)(ulong)indent_00,uVar8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
            uVar8 = extraout_EDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._0_8_ != &local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
              uVar8 = extraout_EDX_00;
            }
            pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(ulong)local_244,uVar8);
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_278._0_8_,
                                CONCAT44(uStack_26c,local_278._8_4_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._0_8_ != &local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
            }
          }
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
          print_props((string *)local_278,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)(p_Var13 + 5),indent_00);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ != &local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
          }
          p_Var10 = *(_Base_ptr *)(p_Var13 + 0x27);
          p_Var6 = p_Var13[0x26]._M_right;
          lVar12 = (long)p_Var10 - (long)p_Var6 >> 5;
          this = p_Var13[4]._M_parent;
          p_Var1 = p_Var13[4]._M_left;
          if (lVar12 == ((long)p_Var1 - (long)this >> 3) * -0x77dc7c4cf2ae9cdb) {
            local_278._8_4_ = 0;
            local_268._M_allocated_capacity = 0;
            local_268._8_8_ = local_278 + 8;
            local_250 = 0;
            local_258 = (undefined1 *)local_268._8_8_;
            if (p_Var1 != this) {
              lVar12 = 0;
              uVar14 = 0;
              do {
                local_220._M_dataplus._M_p = (pointer)((long)&this->_M_color + lVar12);
                ::std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec_const*>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                            *)local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&this[1]._M_parent + lVar12),(PrimSpec **)&local_220);
                uVar14 = uVar14 + 1;
                this = p_Var13[4]._M_parent;
                lVar12 = lVar12 + 0x568;
              } while (uVar14 < (ulong)(((long)p_Var13[4]._M_left - (long)this >> 3) *
                                       -0x77dc7c4cf2ae9cdb));
              p_Var6 = p_Var13[0x26]._M_right;
              p_Var10 = *(_Base_ptr *)(p_Var13 + 0x27);
            }
            if (p_Var10 != p_Var6) {
              lVar12 = 8;
              uVar14 = 0;
              do {
                local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                lVar2 = *(long *)((long)p_Var6 + lVar12 + -8);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_220,lVar2,
                           *(long *)((long)&p_Var6->_M_color + lVar12) + lVar2);
                iVar7 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                                *)local_278,&local_220);
                if (iVar7._M_node != (_Base_ptr)(local_278 + 8)) {
                  prim::print_primspec_abi_cxx11_
                            (&local_240,*(prim **)(iVar7._M_node + 2),(PrimSpec *)(ulong)indent_00,
                             (uint32_t)(_Base_ptr)(local_278 + 8));
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_240._M_dataplus._M_p != &local_240.field_2) {
                    operator_delete(local_240._M_dataplus._M_p,
                                    local_240.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p,
                                  local_220.field_2._M_allocated_capacity + 1);
                }
                uVar14 = uVar14 + 1;
                p_Var6 = p_Var13[0x26]._M_right;
                lVar12 = lVar12 + 0x20;
              } while (uVar14 < (ulong)(*(long *)(p_Var13 + 0x27) - (long)p_Var6 >> 5));
            }
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                        *)local_278,(_Link_type)local_268._M_allocated_capacity);
            uVar8 = extraout_EDX_01;
          }
          else {
            for (; uVar8 = (uint32_t)lVar12, this != p_Var1; this = (_Base_ptr)&this[0x2b]._M_parent
                ) {
              prim::print_primspec_abi_cxx11_
                        ((string *)local_278,(prim *)this,(PrimSpec *)(ulong)indent_00,
                         (uint32_t)p_Var10);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
              lVar12 = extraout_RDX_04;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ != &local_268) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1)
                               );
                lVar12 = extraout_RDX_05;
              }
            }
          }
          pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(ulong)local_244,uVar8);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_)
                             );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ != &local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
          }
          auVar16 = ::std::_Rb_tree_increment(p_Var13);
          bVar15 = (_Base_ptr *)auVar16._0_8_ == local_1c0;
        }
        pprint::Indent_abi_cxx11_
                  ((string *)local_278,(pprint *)(local_1d8 & 0xffffffff),auVar16._8_4_);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
        p_Var13 = local_1c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ != &local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
          p_Var13 = local_1c8;
        }
      }
      auVar17 = ::std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)auVar17._0_8_ != local_1d0);
  }
  psVar3 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string print_variantSetSpecStmt(
    const std::map<std::string, VariantSetSpec> &vslist,
    const uint32_t indent) {
  std::stringstream ss;

  // ss << "# variantSet.size = " << std::to_string(vslist.size()) << "\n";
  for (const auto &variantSet : vslist) {
    if (variantSet.second.variantSet.empty()) {
      continue;
    }

    ss << pprint::Indent(indent) << "variantSet " << quote(variantSet.first)
       << " = {\n";

    for (const auto &item : variantSet.second.variantSet) {
      ss << pprint::Indent(indent + 1) << quote(item.first) << " ";

      if (item.second.metas().authored()) {
        ss << "(\n";
        ss << print_prim_metas(item.second.metas(), indent + 2);
        ss << pprint::Indent(indent + 1) << ") ";
      }

      ss << "{\n";

      // props
      ss << print_props(item.second.props(), indent + 2);

      // primChildren
      // TODO: print child Prims based on `primChildren` Prim metadata
      const auto &variantPrimMetas = item.second.metas();
      const auto &variantPrimChildren = item.second.children();

      if (variantPrimMetas.primChildren.size() == variantPrimChildren.size()) {
        std::map<std::string, const PrimSpec *> primNameTable;
        for (size_t i = 0; i < variantPrimChildren.size(); i++) {
          primNameTable.emplace(variantPrimChildren[i].name(),
                                &variantPrimChildren[i]);
        }

        for (size_t i = 0; i < variantPrimMetas.primChildren.size(); i++) {
          value::token nameTok = variantPrimMetas.primChildren[i];
          DCOUT(fmt::format("variantPrimChildren  {}/{} = {}", i,
                            variantPrimMetas.primChildren.size(),
                            nameTok.str()));
          const auto it = primNameTable.find(nameTok.str());
          if (it != primNameTable.end()) {
            ss << prim::print_primspec(*(it->second), indent + 2);
          } else {
            // TODO: Report warning?
          }
        }
      } else {
        for (const auto &child : variantPrimChildren) {
          ss << prim::print_primspec(child, indent + 2);
        }
      }

      // ss << "# variantSet end\n";
      ss << pprint::Indent(indent + 1) << "}\n";
    }

    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}